

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O0

void __thiscall
LinearRegression::LinearRegression(LinearRegression *this,shared_ptr<Launcher> *launcher)

{
  undefined8 *in_RDI;
  Launcher *in_stack_ffffffffffffff88;
  Launcher *this_00;
  Application *in_stack_ffffffffffffff90;
  string *this_01;
  
  Application::Application(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__LinearRegression_0037f988;
  this_01 = (string *)(in_RDI + 10);
  std::__cxx11::string::string(this_01);
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x1e5d72);
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x1e5d85);
  std::bitset<100UL>::bitset((bitset<100UL> *)0x1e5d96);
  in_RDI[0x15] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1e5db7);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1e5dc1);
  Launcher::getCompiler(in_stack_ffffffffffffff88);
  this_00 = (Launcher *)&stack0xffffffffffffffe0;
  std::shared_ptr<QueryCompiler>::operator=
            ((shared_ptr<QueryCompiler> *)this_01,(shared_ptr<QueryCompiler> *)this_00);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x1e5df0);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1e5dfa);
  Launcher::getTreeDecomposition(this_00);
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)this_01,(shared_ptr<TreeDecomposition> *)this_00);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x1e5e29);
  return;
}

Assistant:

LinearRegression::LinearRegression(shared_ptr<Launcher> launcher)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}